

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

int Cbs2_ManSolve2(Cbs2_Man_t *p,int iLit,int iLit2)

{
  int iVar1;
  int local_1c;
  int RetValue;
  int iLit2_local;
  int iLit_local;
  Cbs2_Man_t *p_local;
  
  local_1c = 0;
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x587,"int Cbs2_ManSolve2(Cbs2_Man_t *, int, int)");
  }
  if (((p->pJust).iHead != 0) || ((p->pJust).iTail != 0)) {
    __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x588,"int Cbs2_ManSolve2(Cbs2_Man_t *, int, int)");
  }
  if (((p->pClauses).iHead != 1) || ((p->pClauses).iTail != 1)) {
    __assert_fail("p->pClauses.iHead == 1 && p->pClauses.iTail == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x589,"int Cbs2_ManSolve2(Cbs2_Man_t *, int, int)");
  }
  (p->Pars).nBTThisNc = 0;
  (p->Pars).nJustThis = 0;
  (p->Pars).nBTThis = 0;
  Cbs2_ManAssign(p,iLit,0,0,0);
  if (iLit2 != 0) {
    Cbs2_ManAssign(p,iLit2,0,0,0);
  }
  iVar1 = Cbs2_ManSolve_rec(p,0);
  if (iVar1 == 0) {
    iVar1 = Cbs2_ManCheckLimits(p);
    if (iVar1 == 0) {
      Cbs2_ManSaveModelAll(p,p->vModel);
      goto LAB_00925874;
    }
  }
  local_1c = 1;
LAB_00925874:
  Cbs2_ManCancelUntil(p,0);
  Cbs2_ManCleanWatch(p);
  Cbs2_ManBumpClean(p);
  (p->pJust).iTail = 0;
  (p->pJust).iHead = 0;
  (p->pClauses).iTail = 1;
  (p->pClauses).iHead = 1;
  (p->Pars).nBTTotal = (p->Pars).nBTThis + (p->Pars).nBTTotal;
  iVar1 = Abc_MaxInt((p->Pars).nJustTotal,(p->Pars).nJustThis);
  (p->Pars).nJustTotal = iVar1;
  iVar1 = Cbs2_ManCheckLimits(p);
  if (iVar1 != 0) {
    local_1c = -1;
  }
  return local_1c;
}

Assistant:

int Cbs2_ManSolve2( Cbs2_Man_t * p, int iLit, int iLit2 )
{
    int RetValue = 0;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    assert( p->pClauses.iHead == 1 && p->pClauses.iTail == 1 );
    p->Pars.nBTThis = p->Pars.nJustThis = p->Pars.nBTThisNc = 0;
    Cbs2_ManAssign( p, iLit, 0, 0, 0 );
    if ( iLit2 ) 
    Cbs2_ManAssign( p, iLit2, 0, 0, 0 );
    if ( !Cbs2_ManSolve_rec(p, 0) && !Cbs2_ManCheckLimits(p) )
        Cbs2_ManSaveModelAll( p, p->vModel );
    else
        RetValue = 1;
    Cbs2_ManCancelUntil( p, 0 );
    Cbs2_ManCleanWatch( p );
    Cbs2_ManBumpClean( p );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Cbs2_ManCheckLimits( p ) )
        RetValue = -1;
    return RetValue;
}